

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O0

void __thiscall Uniforms::addDefine(Uniforms *this,string *_define,string *_value)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_30;
  _Self local_28;
  iterator it;
  string *_value_local;
  string *_define_local;
  Uniforms *this_local;
  
  it._M_node = (_Base_ptr)_value;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>_>
       ::begin(&(this->super_Scene).models);
  while( true ) {
    local_30._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>_>
         ::end(&(this->super_Scene).models);
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
             ::operator->(&local_28);
    vera::Model::addDefine(ppVar2->second,_define,(string *)it._M_node);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
    ::operator++(&local_28);
  }
  return;
}

Assistant:

void Uniforms::addDefine(const std::string& _define, const std::string& _value) {
    for (vera::ModelsMap::iterator it = models.begin(); it != models.end(); ++it)
        it->second->addDefine(_define, _value);
}